

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.h
# Opt level: O3

CServerFilter * allocator_default<CServerBrowserFilter::CServerFilter>::alloc_array(int size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong *puVar3;
  ulong uVar4;
  ulong uVar5;
  CServerFilter *this;
  long lVar6;
  
  uVar5 = (ulong)size;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar5;
  uVar2 = SUB168(auVar1 * ZEXT816(0xe8),0);
  uVar4 = uVar2 + 8;
  if (0xfffffffffffffff7 < uVar2) {
    uVar4 = 0xffffffffffffffff;
  }
  if (SUB168(auVar1 * ZEXT816(0xe8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  puVar3 = (ulong *)operator_new__(uVar4);
  *puVar3 = uVar5;
  if (size != 0) {
    lVar6 = 0;
    this = (CServerFilter *)(puVar3 + 1);
    do {
      CServerBrowserFilter::CServerFilter::CServerFilter(this);
      lVar6 = lVar6 + -0xe8;
      this = this + 1;
    } while (uVar5 * -0xe8 - lVar6 != 0);
  }
  return (CServerFilter *)(puVar3 + 1);
}

Assistant:

static T *alloc_array(int size) { return new T [size]; }